

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffio.c
# Opt level: O1

void tidyBufAllocWithAllocator(TidyBuffer *buf,TidyAllocator *allocator,uint allocSize)

{
  if (buf != (TidyBuffer *)0x0) {
    buf->allocator = (TidyAllocator *)0x0;
    buf->bp = (byte *)0x0;
    buf->size = 0;
    buf->allocated = 0;
    *(undefined8 *)&buf->next = 0;
    if (allocator == (TidyAllocator *)0x0) {
      allocator = &prvTidyg_default_allocator;
    }
    buf->allocator = allocator;
    tidyBufCheckAlloc(buf,allocSize,0);
    buf->next = 0;
    return;
  }
  __assert_fail("buf != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/buffio.c"
                ,0x46,"void tidyBufInitWithAllocator(TidyBuffer *, TidyAllocator *)");
}

Assistant:

void TIDY_CALL tidyBufInitWithAllocator( TidyBuffer* buf,
                                         TidyAllocator *allocator )
{
    assert( buf != NULL );
    TidyClearMemory( buf, sizeof(TidyBuffer) );
    buf->allocator = allocator ? allocator : &TY_(g_default_allocator);
}